

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O2

void MOJOSHADER_effectSetTechnique(MOJOSHADER_effect *effect,MOJOSHADER_effectTechnique *technique)

{
  long lVar1;
  long lVar2;
  MOJOSHADER_effectTechnique *pMVar3;
  
  lVar2 = -1;
  lVar1 = -0x28;
  do {
    lVar2 = lVar2 + 1;
    if (effect->technique_count <= lVar2) {
      __assert_fail("0 && \"Technique is not part of this effect!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0x6a9,
                    "void MOJOSHADER_effectSetTechnique(MOJOSHADER_effect *, const MOJOSHADER_effectTechnique *)"
                   );
    }
    pMVar3 = (MOJOSHADER_effectTechnique *)((long)&effect->techniques[1].name + lVar1);
    lVar1 = lVar1 + 0x28;
  } while (pMVar3 != technique);
  effect->current_technique = technique;
  return;
}

Assistant:

void MOJOSHADER_effectSetTechnique(MOJOSHADER_effect *effect,
                                   const MOJOSHADER_effectTechnique *technique)
{
    int i;
    for (i = 0; i < effect->technique_count; i++)
    {
        if (technique == &effect->techniques[i])
        {
            effect->current_technique = technique;
            return;
        } // if
    } // for
    assert(0 && "Technique is not part of this effect!");
}